

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O0

int WebPPictureAllocYUVA(WebPPicture *picture,int width,int height)

{
  WebPEncCSP WVar1;
  WebPEncCSP WVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint8_t *puVar6;
  int in_EDX;
  int in_ESI;
  WebPPicture *in_RDI;
  uint8_t *mem;
  uint64_t total_size;
  uint64_t a_size;
  uint64_t uv_size;
  uint64_t y_size;
  int a_stride;
  int a_width;
  int uv_stride;
  int uv_height;
  int uv_width;
  int y_stride;
  int has_alpha;
  WebPEncCSP uv_csp;
  int local_64;
  size_t in_stack_ffffffffffffffa0;
  int local_4;
  
  WVar1 = in_RDI->colorspace;
  WVar2 = in_RDI->colorspace;
  iVar3 = (int)((long)in_ESI + 1 >> 1);
  iVar4 = (int)((long)in_EDX + 1 >> 1);
  WebPSafeFree((void *)0x1569e0);
  WebPPictureResetBufferYUVA(in_RDI);
  if ((WVar1 & WEBP_CSP_UV_MASK) == WEBP_YUV420) {
    local_64 = in_ESI;
    if ((WVar2 & WEBP_CSP_ALPHA_BIT) == WEBP_YUV420) {
      local_64 = 0;
    }
    lVar5 = (long)iVar3 * (long)iVar4;
    if ((((in_ESI < 1) || (in_EDX < 1)) || (iVar3 < 1)) || (iVar4 < 1)) {
      local_4 = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_BAD_DIMENSION);
    }
    else {
      puVar6 = (uint8_t *)
               WebPSafeMalloc((long)in_ESI * (long)in_EDX + (long)local_64 * (long)in_EDX +
                              lVar5 * 2,in_stack_ffffffffffffffa0);
      if (puVar6 == (uint8_t *)0x0) {
        local_4 = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_OUT_OF_MEMORY);
      }
      else {
        in_RDI->memory_ = puVar6;
        in_RDI->y_stride = in_ESI;
        in_RDI->uv_stride = iVar3;
        in_RDI->a_stride = local_64;
        in_RDI->y = puVar6;
        puVar6 = puVar6 + (long)in_ESI * (long)in_EDX;
        in_RDI->u = puVar6;
        in_RDI->v = puVar6 + lVar5;
        if ((long)local_64 * (long)in_EDX != 0) {
          in_RDI->a = puVar6 + lVar5 + lVar5;
        }
        local_4 = 1;
      }
    }
  }
  else {
    local_4 = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_INVALID_CONFIGURATION);
  }
  return local_4;
}

Assistant:

int WebPPictureAllocYUVA(WebPPicture* const picture, int width, int height) {
  const WebPEncCSP uv_csp =
      (WebPEncCSP)((int)picture->colorspace & WEBP_CSP_UV_MASK);
  const int has_alpha = (int)picture->colorspace & WEBP_CSP_ALPHA_BIT;
  const int y_stride = width;
  const int uv_width = (int)(((int64_t)width + 1) >> 1);
  const int uv_height = (int)(((int64_t)height + 1) >> 1);
  const int uv_stride = uv_width;
  int a_width, a_stride;
  uint64_t y_size, uv_size, a_size, total_size;
  uint8_t* mem;

  assert(picture != NULL);

  WebPSafeFree(picture->memory_);
  WebPPictureResetBufferYUVA(picture);

  if (uv_csp != WEBP_YUV420) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_INVALID_CONFIGURATION);
  }

  // alpha
  a_width = has_alpha ? width : 0;
  a_stride = a_width;
  y_size = (uint64_t)y_stride * height;
  uv_size = (uint64_t)uv_stride * uv_height;
  a_size =  (uint64_t)a_stride * height;

  total_size = y_size + a_size + 2 * uv_size;

  // Security and validation checks
  if (width <= 0 || height <= 0 ||           // luma/alpha param error
      uv_width <= 0 || uv_height <= 0) {     // u/v param error
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
  }
  // allocate a new buffer.
  mem = (uint8_t*)WebPSafeMalloc(total_size, sizeof(*mem));
  if (mem == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }

  // From now on, we're in the clear, we can no longer fail...
  picture->memory_ = (void*)mem;
  picture->y_stride  = y_stride;
  picture->uv_stride = uv_stride;
  picture->a_stride  = a_stride;

  // TODO(skal): we could align the y/u/v planes and adjust stride.
  picture->y = mem;
  mem += y_size;

  picture->u = mem;
  mem += uv_size;
  picture->v = mem;
  mem += uv_size;

  if (a_size > 0) {
    picture->a = mem;
    mem += a_size;
  }
  (void)mem;  // makes the static analyzer happy
  return 1;
}